

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  PmDeviceID PVar4;
  int iVar5;
  PmDeviceInfo *pPVar6;
  char *local_58;
  PmDeviceInfo *info;
  char *deflt;
  int dur_valid;
  int device_valid;
  int rate_valid;
  int latency_valid;
  int i;
  int default_out;
  int default_in;
  char **argv_local;
  int argc_local;
  
  bVar1 = false;
  bVar2 = false;
  bVar3 = false;
  printf("Apparently this is a 64-bit machine.\n");
  if (argc < 2) {
    show_usage();
  }
  else {
    for (rate_valid = 1; rate_valid < argc; rate_valid = rate_valid + 1) {
      iVar5 = strcmp(argv[rate_valid],"-h");
      if (iVar5 == 0) {
        show_usage();
      }
      else {
        iVar5 = strcmp(argv[rate_valid],"-l");
        if ((iVar5 == 0) && (rate_valid + 1 < argc)) {
          rate_valid = rate_valid + 1;
          latency = atoi(argv[rate_valid]);
          printf("Latency will be %ld\n",(long)latency);
          bVar1 = true;
        }
        else {
          iVar5 = strcmp(argv[rate_valid],"-r");
          if (iVar5 == 0) {
            rate_valid = rate_valid + 1;
            msgrate = atoi(argv[rate_valid]);
            printf("Rate will be %d messages/second\n",(ulong)(uint)msgrate);
            bVar2 = true;
          }
          else {
            iVar5 = strcmp(argv[rate_valid],"-s");
            if (iVar5 == 0) {
              rate_valid = rate_valid + 1;
              duration = atoi(argv[rate_valid]);
              printf("Duration will be %d seconds\n",(ulong)(uint)msgrate);
              bVar3 = true;
            }
            else {
              iVar5 = strcmp(argv[rate_valid],"-n");
              if (iVar5 == 0) {
                printf("Sending expired timestamps (-n)\n");
                expired_timestamps = 1;
              }
              else {
                show_usage();
              }
            }
          }
        }
      }
    }
  }
  if (!bVar1) {
    latency = get_number("Latency in ms: ");
  }
  if (!bVar2) {
    msgrate = get_number("Rate in messages per second: ");
  }
  if (!bVar3) {
    duration = get_number("Duration in seconds: ");
  }
  Pm_GetDefaultInputDeviceID();
  PVar4 = Pm_GetDefaultOutputDeviceID();
  for (rate_valid = 0; iVar5 = Pm_CountDevices(), rate_valid < iVar5; rate_valid = rate_valid + 1) {
    pPVar6 = Pm_GetDeviceInfo(rate_valid);
    if (pPVar6->output != 0) {
      printf("%d: %s, %s",(ulong)(uint)rate_valid,pPVar6->interf,pPVar6->name);
      if (rate_valid == deviceno) {
        local_58 = "selected ";
      }
      else {
        local_58 = "";
        if (rate_valid == PVar4) {
          local_58 = "default ";
        }
      }
      printf(" (%soutput)",local_58);
      printf("\n");
    }
  }
  deviceno = get_number("Output device number: ");
  fast_test();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    int default_in;
    int default_out;
    int i = 0;
    int latency_valid = FALSE;
    int rate_valid = FALSE;
    int device_valid = FALSE;
    int dur_valid = FALSE;
    
    if (sizeof(void *) == 8) 
        printf("Apparently this is a 64-bit machine.\n");
    else if (sizeof(void *) == 4) 
        printf ("Apparently this is a 32-bit machine.\n");
    
    if (argc <= 1) {
        show_usage();
    } else {
        for (i = 1; i < argc; i++) {
            if (strcmp(argv[i], "-h") == 0) {
                show_usage();
            } else if (strcmp(argv[i], "-l") == 0 && (i + 1 < argc)) {
                i = i + 1;
                latency = atoi(argv[i]);
                printf("Latency will be %ld\n", (long) latency);
                latency_valid = TRUE;
            } else if (strcmp(argv[i], "-r") == 0) {
                i = i + 1;
                msgrate = atoi(argv[i]);
                printf("Rate will be %d messages/second\n", msgrate);
                rate_valid = TRUE;
            } else if (strcmp(argv[i], "-s") == 0) {
                i = i + 1;
                duration = atoi(argv[i]);
                printf("Duration will be %d seconds\n", msgrate);
                dur_valid = TRUE;
            } else if (strcmp(argv[i], "-n") == 0) {
                printf("Sending expired timestamps (-n)\n");
                expired_timestamps = TRUE;
            } else {
                show_usage();
            }
        }
    }

    if (!latency_valid) {
        // coerce to known size
        latency = (int32_t) get_number("Latency in ms: "); 
    }

    if (!rate_valid) {
        // coerce from "%d" to known size
        msgrate = (int32_t) get_number("Rate in messages per second: ");
    }

    if (!dur_valid) {
        duration = get_number("Duration in seconds: ");
    }

    /* list device information */
    default_in = Pm_GetDefaultInputDeviceID();
    default_out = Pm_GetDefaultOutputDeviceID();
    for (i = 0; i < Pm_CountDevices(); i++) {
        char *deflt;
        const PmDeviceInfo *info = Pm_GetDeviceInfo(i);
        if (info->output) {
            printf("%d: %s, %s", i, info->interf, info->name);
            deflt = (i == deviceno ? "selected " :
                      (i == default_out ? "default " : ""));
            printf(" (%soutput)", deflt);
            printf("\n");
        }
    }
    
    if (!device_valid) {
        deviceno = get_number("Output device number: ");
    }

    fast_test();
    return 0;
}